

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::ProcessPresetVariables(cmake *this)

{
  CacheEntryType type;
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if ((char)p_Var1[4]._M_color == _S_black) {
      type = UNINITIALIZED;
      if (p_Var1[2]._M_parent != (_Base_ptr)0x0) {
        type = cmState::StringToCacheEntryType((string *)(p_Var1 + 2));
      }
      ProcessCacheArg(this,(string *)(p_Var1 + 1),(string *)(p_Var1 + 3),type);
    }
  }
  return;
}

Assistant:

void cmake::ProcessPresetVariables()
{
  for (auto const& var : this->UnprocessedPresetVariables) {
    if (!var.second) {
      continue;
    }
    cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
    if (!var.second->Type.empty()) {
      type = cmState::StringToCacheEntryType(var.second->Type);
    }
    this->ProcessCacheArg(var.first, var.second->Value, type);
  }
}